

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_lower_upper_factorisation.hpp
# Opt level: O1

bool __thiscall
Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>::factorise
          (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true> *this,
          Matrix_Dense<double,_0UL,_0UL> *a_matrix)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  pointer pVVar2;
  pointer puVar3;
  pointer pdVar4;
  pointer pVVar5;
  pointer pdVar6;
  bool bVar7;
  pointer puVar8;
  ulong uVar9;
  unsigned_long uVar10;
  ulong uVar11;
  ulong uVar12;
  size_type __new_size;
  size_t i_column_sweep;
  ulong uVar13;
  long lVar14;
  size_t i_row_sweep;
  ulong uVar15;
  bool bVar16;
  Scalar max;
  Scalar absA;
  pointer local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  long local_38;
  
  this->factorised = false;
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  operator=(&(this->lu_factorised).
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ,&a_matrix->
              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           );
  local_58 = &this->pivots;
  pVVar2 = (this->lu_factorised).
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           .
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar2 == (this->lu_factorised).
                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                .
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    __new_size = 0;
  }
  else {
    __new_size = (long)(pVVar2->super_vector<double,_std::allocator<double>_>).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pVVar2->super_vector<double,_std::allocator<double>_>).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_58,__new_size);
  puVar8 = (this->pivots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->pivots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar8 != puVar3) {
    uVar10 = 0;
    do {
      *puVar8 = uVar10;
      uVar10 = uVar10 + 1;
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar3);
  }
  bVar16 = (this->lu_factorised).
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           .
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish ==
           (this->lu_factorised).
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           .
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (!bVar16) {
    lVar14 = 0;
    uVar11 = 0;
    do {
      local_60 = (pointer)0x0;
      uVar12 = uVar11;
      uVar15 = uVar11;
      local_38 = lVar14;
      while( true ) {
        pVVar2 = (this->lu_factorised).
                 super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 .
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pVVar2 == (this->lu_factorised).
                      super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                      .
                      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          uVar9 = 0;
        }
        else {
          uVar9 = (long)(pVVar2->super_vector<double,_std::allocator<double>_>).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pVVar2->super_vector<double,_std::allocator<double>_>).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3;
        }
        if (uVar9 <= uVar15) break;
        local_50 = (pointer)ABS(*(double *)
                                 (*(long *)((long)&(pVVar2->
                                                  super_vector<double,_std::allocator<double>_>).
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar14
                                           ) + uVar11 * 8));
        if (((double)local_60 <= (double)local_50) &&
           (bVar7 = is_nearly_equal((Scalar *)&local_50,(Scalar *)&local_60,
                                    (Scalar *)&default_relative,(Scalar *)&default_absolute), !bVar7
           )) {
          local_60 = local_50;
          uVar12 = uVar15;
        }
        uVar15 = uVar15 + 1;
        lVar14 = lVar14 + 0x18;
      }
      if (uVar12 != uVar11) {
        puVar8 = (local_58->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar10 = puVar8[uVar11];
        puVar8[uVar11] = puVar8[uVar12];
        puVar8[uVar12] = uVar10;
        pvVar1 = &pVVar2[uVar11].super_vector<double,_std::allocator<double>_>;
        local_50 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        local_48 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        local_40 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::_M_move_assign
                  (pvVar1,&pVVar2[uVar12].super_vector<double,_std::allocator<double>_>);
        std::vector<double,_std::allocator<double>_>::_M_move_assign
                  (&pVVar2[uVar12].super_vector<double,_std::allocator<double>_>,&local_50);
        if (local_50 != (pointer)0x0) {
          operator_delete(local_50,(long)local_40 - (long)local_50);
        }
      }
      pVVar2 = (this->lu_factorised).
               super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               .
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar4 = pVVar2[uVar11].super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (ABS(pdVar4[uVar11]) < this->factorisation_tolerance) {
        if (bVar16 == false) {
          return false;
        }
        break;
      }
      pVVar5 = (this->lu_factorised).
               super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               .
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar12 = uVar11 + 1;
      for (uVar15 = uVar12;
          uVar15 < (ulong)(((long)pVVar5 - (long)pVVar2 >> 3) * -0x5555555555555555);
          uVar15 = uVar15 + 1) {
        pdVar6 = pVVar2[uVar15].super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar6[uVar11] = pdVar6[uVar11] / pdVar4[uVar11];
        uVar9 = uVar12;
        while( true ) {
          if (pVVar2 == pVVar5) {
            uVar13 = 0;
          }
          else {
            uVar13 = (long)(pVVar2->super_vector<double,_std::allocator<double>_>).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pVVar2->super_vector<double,_std::allocator<double>_>).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3;
          }
          if (uVar13 <= uVar9) break;
          pdVar6[uVar9] = pdVar6[uVar9] - pdVar6[uVar11] * pdVar4[uVar9];
          uVar9 = uVar9 + 1;
        }
      }
      lVar14 = local_38 + 0x18;
      bVar7 = uVar12 < (ulong)(((long)(this->lu_factorised).
                                      super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                      .
                                      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->lu_factorised).
                                      super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                      .
                                      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555);
      bVar16 = !bVar7;
      uVar11 = uVar12;
    } while (bVar7);
  }
  this->factorised = true;
  return bVar16;
}

Assistant:

bool Direct_Lower_Upper_Factorisation<_solver_type, _size, _pivot>::factorise(
const Matrix_Dense<Scalar, _size, _size>& a_matrix) {

  // Initialise factorisation data.
  factorised = false;
  lu_factorised = a_matrix;
  if(_pivot) {
    pivots.resize(lu_factorised.size_column());
    std::iota(pivots.begin(), pivots.end(), 0);
  }

  // Factorise A into L and U.
  for(std::size_t i_row = 0; i_row < lu_factorised.size_row(); ++i_row) {

    // Pivoting
    if(_pivot) {

      // Find largest remaining column value to pivot on.
      Scalar max = 0.0;
      std::size_t i_max = i_row;
      for(std::size_t i_row_sweep = i_row; i_row_sweep < lu_factorised.size_column(); ++i_row_sweep) {
        const Scalar absA = std::abs(lu_factorised[i_row_sweep][i_row]);
        if(is_nearly_greater(absA, max)) {
          max = absA;
          i_max = i_row_sweep;
        }
      }

      // Pivot if larger value found.
      if(i_max != i_row) {
        std::swap(pivots[i_row], pivots[i_max]);
        std::swap(lu_factorised[i_row], lu_factorised[i_max]);
      }
    }

    // Check degeneracy.
    if(std::abs(lu_factorised[i_row][i_row]) < factorisation_tolerance) return false;

    // Decomposition, actual factorisation to compute L and U.
    for(std::size_t i_row_sweep = i_row + 1; i_row_sweep < lu_factorised.size_row(); ++i_row_sweep) {
      lu_factorised[i_row_sweep][i_row] /= lu_factorised[i_row][i_row];

      for(std::size_t i_column_sweep = i_row + 1; i_column_sweep < lu_factorised.size_column(); ++i_column_sweep)
        lu_factorised[i_row_sweep][i_column_sweep] -=
        lu_factorised[i_row_sweep][i_row] * lu_factorised[i_row][i_column_sweep];
    }
  }

  factorised = true;
  return true;
}